

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.cpp
# Opt level: O2

double __thiscall hmm::calculateProbability(hmm *this)

{
  unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
  *this_00;
  unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>
  *this_01;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *this_02;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *this_03;
  _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_04;
  _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_05;
  int *__k;
  _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_06;
  _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_07;
  bool bVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  int iVar4;
  hmm *this_08;
  double dVar5;
  int local_8c;
  double local_88;
  int local_80;
  int local_7c;
  hmm *local_78;
  double local_70;
  int local_64;
  double local_60;
  _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_58;
  _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_50;
  int *local_48;
  _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_40;
  _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_38;
  
  bVar1 = createMaps(this);
  if (bVar1) {
    this_00 = &this->observedChroma1;
    iVar4 = 1;
    local_8c = iVar4;
    pmVar2 = std::__detail::
             _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,&local_8c);
    dVar5 = B1(this,'C',*pmVar2,1);
    local_88 = dVar5 * 0.5;
    this_01 = &this->observedChroma2;
    local_80 = iVar4;
    local_78 = this;
    pmVar2 = std::__detail::
             _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_01,&local_80);
    dVar5 = B2(local_78,'C',*pmVar2,1);
    local_88 = dVar5 * local_88;
    this_02 = &local_78->CProb;
    local_7c = iVar4;
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_02,&local_7c);
    *pmVar3 = local_88;
    local_8c = iVar4;
    local_38 = (_Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)this_00;
    pmVar2 = std::__detail::
             _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,&local_8c);
    dVar5 = B1(local_78,'O',*pmVar2,1);
    this_08 = local_78;
    local_88 = dVar5 * 0.5;
    local_80 = iVar4;
    local_40 = (_Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)this_01;
    pmVar2 = std::__detail::
             _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_01,&local_80);
    dVar5 = B2(this_08,'O',*pmVar2,1);
    local_88 = dVar5 * local_88;
    this_03 = &this_08->OProb;
    local_7c = iVar4;
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_03,&local_7c);
    *pmVar3 = local_88;
    local_8c = iVar4;
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_02,&local_8c);
    local_88 = *pmVar3;
    local_80 = iVar4;
    local_50 = (_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)this_02;
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_02,&local_80);
    *pmVar3 = local_88;
    local_8c = iVar4;
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_03,&local_8c);
    local_88 = *pmVar3;
    local_80 = iVar4;
    local_58 = (_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)this_03;
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_03,&local_80);
    this_05 = local_50;
    *pmVar3 = local_88;
    local_48 = &this_08->T;
    local_8c = 1;
    while( true ) {
      this_07 = local_38;
      __k = local_48;
      if (*local_48 <= local_8c) break;
      local_80 = local_8c + 1;
      pmVar2 = std::__detail::
               _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_38,&local_80);
      local_88 = B1(this_08,'C',*pmVar2,local_8c + 1);
      this_06 = local_40;
      local_7c = local_8c + 1;
      pmVar2 = std::__detail::
               _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_40,&local_7c);
      local_60 = B2(local_78,'C',*pmVar2,local_8c + 1);
      local_60 = local_60 * local_88;
      local_88 = A(local_78,'C','C',local_8c + 1);
      pmVar3 = std::__detail::
               _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](this_05,&local_8c);
      local_88 = local_88 * *pmVar3;
      local_70 = A(local_78,'O','C',local_8c + 1);
      this_04 = local_58;
      pmVar3 = std::__detail::
               _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_58,&local_8c);
      local_70 = (local_70 * *pmVar3 + local_88) * local_60;
      local_64 = local_8c + 1;
      pmVar3 = std::__detail::
               _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](this_05,&local_64);
      *pmVar3 = local_70;
      local_80 = local_8c + 1;
      pmVar2 = std::__detail::
               _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](this_07,&local_80);
      local_88 = B1(local_78,'O',*pmVar2,local_8c + 1);
      this_08 = local_78;
      local_7c = local_8c + 1;
      pmVar2 = std::__detail::
               _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](this_06,&local_7c);
      local_60 = B2(this_08,'O',*pmVar2,local_8c + 1);
      local_60 = local_60 * local_88;
      local_88 = A(this_08,'C','O',local_8c + 1);
      pmVar3 = std::__detail::
               _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](this_05,&local_8c);
      local_88 = local_88 * *pmVar3;
      local_70 = A(this_08,'O','O',local_8c + 1);
      pmVar3 = std::__detail::
               _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](this_04,&local_8c);
      local_70 = (local_70 * *pmVar3 + local_88) * local_60;
      local_64 = local_8c + 1;
      pmVar3 = std::__detail::
               _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](this_04,&local_64);
      *pmVar3 = local_70;
      local_8c = local_8c + 1;
    }
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_50,local_48);
    local_78 = (hmm *)*pmVar3;
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_58,__k);
    dVar5 = (double)local_78 + *pmVar3;
  }
  else {
    dVar5 = -1000.0;
  }
  return dVar5;
}

Assistant:

double hmm::calculateProbability(){
    if(!this->createMaps()){
        return -1000;
    }
    this->CProb[1] = 0.5 * B1('C',this->observedChroma1[1],1) * B2('C',this->observedChroma2[1],1);
    this->OProb[1] = 0.5 * B1('O',this->observedChroma1[1],1) * B2('O',this->observedChroma2[1],1);
//    cout<<"Initial: "<<endl;
//    cout<<"Cprob[1]: "<<this->CProb[1]<<endl;
//    cout<<"Oprob[1]: "<<this->CProb[1]<<endl;
//    cout<<"----------------------------"<<endl;
//    double scaleFactor = 1/((double)(this->CProb[1]+this->OProb[1]));
    this->CProb[1] = this->CProb[1];
    this->OProb[1] = this->OProb[1];
//    double scaleFactorLog = log10(scaleFactor);

    for(int t = 1; t<T; t++){
        this->CProb[t+1] = B1('C',this->observedChroma1[t+1],t+1) * B2('C',this->observedChroma2[t+1],t+1) * ( A('C','C',t+1)*this->CProb[t] + A('O','C',t+1)*this->OProb[t] );
        this->OProb[t+1] = B1('O',this->observedChroma1[t+1],t+1) * B2('O',this->observedChroma2[t+1],t+1) * ( A('C','O',t+1)*this->CProb[t] + A('O','O',t+1)*this->OProb[t] );
//        cout<<"Iteration: "<<t+1<<endl;
//        cout<<"Cprob["<<t+1<<"]: "<<this->CProb[t+1]<<endl;
//        cout<<"Oprob["<<t+1<<"]: "<<this->OProb[t+1]<<endl;
//        cout<<"----------------------------"<<endl;
//        scaleFactor = 1/((double)(this->CProb[t+1]+this->OProb[t+1]));
//        this->CProb[t+1] = this->CProb[t+1]*(double)scaleFactor;
//        this->OProb[t+1] =this->OProb[t+1]*(double)scaleFactor;

//        scaleFactorLog += log10(scaleFactor);
    }

    double prob = this->CProb[T]+this->OProb[T];
    return prob/*pow10(-1*scaleFactorLog)*/;

}